

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configreader.cpp
# Opt level: O3

token_t __thiscall ConfigReader::tokenize(ConfigReader *this,string *tokstr)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  uint uVar4;
  
  tokstr->_M_string_length = 0;
  *(tokstr->_M_dataplus)._M_p = '\0';
  bVar1 = this->m_tokchar;
  while ((bVar1 == 9 || (bVar1 == 0x20))) {
    uVar4 = *(uint *)(this->m_is + *(long *)(*(long *)this->m_is + -0x18) + 0x20);
    if ((uVar4 & 2) != 0) goto LAB_001286f1;
    bVar1 = std::istream::get();
    this->m_tokchar = bVar1;
  }
  uVar4 = *(uint *)(this->m_is + *(long *)(*(long *)this->m_is + -0x18) + 0x20);
LAB_001286f1:
  if ((uVar4 & 2) != 0) {
    return TOK_EOF;
  }
  cVar2 = (char)tokstr;
  if (bVar1 < 0x29) {
    if (bVar1 < 0x23) {
      if ((bVar1 == 10) || (bVar1 == 0xd)) {
        cVar2 = std::istream::get();
        this->m_tokchar = cVar2;
        this->m_lineNum = this->m_lineNum + 1;
        return TOK_EOL;
      }
    }
    else {
      if (bVar1 == 0x23) {
        cVar2 = std::istream::get();
        this->m_tokchar = cVar2;
        return TOK_HASH;
      }
      if (bVar1 == 0x28) {
        cVar2 = std::istream::get();
        this->m_tokchar = cVar2;
        return TOK_LPAREN;
      }
    }
  }
  else if (bVar1 < 0x3b) {
    if (bVar1 == 0x29) {
      cVar2 = std::istream::get();
      this->m_tokchar = cVar2;
      return TOK_RPAREN;
    }
    if (bVar1 == 0x2d) {
      std::__cxx11::string::_M_replace_aux((ulong)tokstr,0,tokstr->_M_string_length,'\x01');
      cVar3 = std::istream::get();
      this->m_tokchar = cVar3;
      if ((byte)(cVar3 - 0x30U) < 10) {
        while ((((byte)(cVar3 - 0x30U) < 10 || (cVar3 == 'e')) || (cVar3 == '.'))) {
          std::__cxx11::string::push_back(cVar2);
          cVar3 = std::istream::get();
          this->m_tokchar = cVar3;
        }
        return TOK_NUMBER;
      }
      return TOK_MINUS;
    }
  }
  else {
    if (bVar1 == 0x3b) {
      cVar2 = std::istream::get();
      this->m_tokchar = cVar2;
      return TOK_SEMICOL;
    }
    if (bVar1 == 0x5b) {
      cVar2 = std::istream::get();
      this->m_tokchar = cVar2;
      return TOK_LBRACKET;
    }
    if (bVar1 == 0x5d) {
      cVar2 = std::istream::get();
      this->m_tokchar = cVar2;
      return TOK_RBRACKET;
    }
  }
  if ((((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a) || (bVar1 == 0x21)) || (bVar1 == 0x5f)) {
    std::__cxx11::string::_M_replace_aux((ulong)tokstr,0,tokstr->_M_string_length,'\x01');
    while( true ) {
      bVar1 = std::istream::get();
      this->m_tokchar = bVar1;
      if (((0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) && (bVar1 != 0x21)) &&
         (((bVar1 != 0x5f && (9 < (byte)(bVar1 - 0x30))) &&
          ((uVar4 = bVar1 - 0x2e, 0x2f < uVar4 ||
           ((0xe00000014003U >> ((ulong)uVar4 & 0x3f) & 1) == 0)))))) break;
      std::__cxx11::string::push_back(cVar2);
    }
    return TOK_IDENT;
  }
  if (bVar1 == 0x22) {
    while( true ) {
      cVar3 = std::istream::get();
      this->m_tokchar = cVar3;
      if (cVar3 == '\n') {
        return TOK_STRING;
      }
      if (cVar3 == '\r') break;
      if (cVar3 == '\"') {
        cVar2 = std::istream::get();
        this->m_tokchar = cVar2;
        return TOK_STRING;
      }
      std::__cxx11::string::push_back(cVar2);
    }
    return TOK_STRING;
  }
  if ((byte)(bVar1 - 0x30) < 10) {
    std::__cxx11::string::_M_replace_aux((ulong)tokstr,0,tokstr->_M_string_length,'\x01');
    while( true ) {
      cVar3 = std::istream::get();
      this->m_tokchar = cVar3;
      if (((9 < (byte)(cVar3 - 0x30U)) && (cVar3 != 'e')) && (cVar3 != '.')) break;
      std::__cxx11::string::push_back(cVar2);
    }
    return TOK_NUMBER;
  }
  cVar2 = std::istream::get();
  this->m_tokchar = cVar2;
  return TOK_ERR;
}

Assistant:

ConfigReader::token_t ConfigReader::tokenize(std::string &tokstr)
{
    tokstr.clear();

    while(isWhitespace(m_tokchar) && !m_is->eof())
    {
        m_tokchar = m_is->get();
    }

    if (m_is->eof())
    {
        return TOK_EOF;
    }

    if ((m_tokchar==10) || (m_tokchar==13))
    {
        m_tokchar = m_is->get();
        m_lineNum++;
        return TOK_EOL;
    }

    if (m_tokchar=='#')
    {
        m_tokchar = m_is->get();
        return TOK_HASH; 
    }

    if (m_tokchar==';')
    {
        m_tokchar = m_is->get();
        return TOK_SEMICOL; 
    }

    if (m_tokchar=='(')
    {
        m_tokchar = m_is->get();
        return TOK_LPAREN;
    }

    if (m_tokchar==')')
    {
        m_tokchar = m_is->get();
        return TOK_RPAREN;
    }

    if (m_tokchar=='[')
    {
        m_tokchar = m_is->get();
        return TOK_LBRACKET;
    }

    if (m_tokchar==']')
    {
        m_tokchar = m_is->get();
        return TOK_RBRACKET;
    }

    if (m_tokchar=='-')
    {
        // could be the start of a number
        tokstr = m_tokchar;
        m_tokchar = m_is->get();
        if (isDigit(m_tokchar))
        {
            // it is indeed a number!
            while(isDigit(m_tokchar) || (m_tokchar == '.') || (m_tokchar == 'e'))
            {
                tokstr += m_tokchar;
                m_tokchar = m_is->get();
            }
            return TOK_NUMBER;            
        }
        return TOK_MINUS;
    }

    if (isAlpha(m_tokchar))
    {
        tokstr = m_tokchar;
        m_tokchar = m_is->get();
        while(isAlphaNumeric(m_tokchar) || isSpecialIdentChar(m_tokchar))
        {            
            tokstr += m_tokchar;
            m_tokchar = m_is->get();
        }
        return TOK_IDENT;
    }

    if (m_tokchar=='"')
    {
        m_tokchar = m_is->get();
        while((m_tokchar != '"') && (m_tokchar != 10) && (m_tokchar != 13))
        {
            tokstr += m_tokchar;
            m_tokchar = m_is->get();
        }

        // skip closing quotes
        if (m_tokchar == '"')
        {
            m_tokchar = m_is->get();
        }

        // error on newline
        if ((m_tokchar == 10) || (m_tokchar == 13))
        {
            // TODO: error, string cannot continue after newline!
        }
        return TOK_STRING;
    }

    if (isDigit(m_tokchar))
    {
        tokstr = m_tokchar;
        m_tokchar = m_is->get();
        while(isDigit(m_tokchar) || (m_tokchar == '.') || (m_tokchar == 'e'))
        {
            tokstr += m_tokchar;
            m_tokchar = m_is->get();
        }
        return TOK_NUMBER;
    }

    m_tokchar = m_is->get();
    return TOK_ERR;
}